

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::VarintTest_TestZigzagToInt_Test::~VarintTest_TestZigzagToInt_Test
          (VarintTest_TestZigzagToInt_Test *this)

{
  VarintTest_TestZigzagToInt_Test *this_local;
  
  ~VarintTest_TestZigzagToInt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VarintTest, TestZigzagToInt)
{
    ASSERT_EQ(0, Varint::ZigzagToInt(0));
    ASSERT_EQ(-1, Varint::ZigzagToInt(1));
    ASSERT_EQ(1, Varint::ZigzagToInt(2));
    ASSERT_EQ(-2, Varint::ZigzagToInt(3));
    ASSERT_EQ(2, Varint::ZigzagToInt(4));
    ASSERT_EQ(-3, Varint::ZigzagToInt(5));
    ASSERT_EQ(3, Varint::ZigzagToInt(6));
    ASSERT_EQ(-4, Varint::ZigzagToInt(7));
    ASSERT_EQ(4, Varint::ZigzagToInt(8));

    ASSERT_EQ(1000, Varint::ZigzagToInt(2000));
    ASSERT_EQ(-1000, Varint::ZigzagToInt(1999));
}